

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmObjDate::load_image_data(CVmObjDate *this,char *ptr,size_t siz)

{
  CVmVarHeap *pCVar1;
  vm_date_ext *pvVar2;
  long lVar3;
  unsigned_long uVar4;
  void *in_RSI;
  long in_RDI;
  vm_date_ext *ext;
  CVmObjDate *in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RDI + 8) != 0) {
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])(pCVar1,*(undefined8 *)(in_RDI + 8));
  }
  pvVar2 = vm_date_ext::alloc_ext(in_stack_ffffffffffffffe0);
  *(vm_date_ext **)(in_RDI + 8) = pvVar2;
  lVar3 = ::osrp4s(in_RSI);
  pvVar2->dayno = (int32_t)lVar3;
  uVar4 = ::osrp4((void *)((long)in_RSI + 4));
  pvVar2->daytime = (int32_t)uVar4;
  return;
}

Assistant:

void CVmObjDate::load_image_data(VMG_ const char *ptr, size_t siz)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* allocate the extension */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* read the image data */
    ext->dayno = osrp4s(ptr);
    ext->daytime = osrp4(ptr+4);
}